

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

mFILE * mfreopen(char *path,char *mode_str,FILE *fp)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  uint local_48;
  int mode;
  int x;
  int b;
  int a;
  int w;
  int r;
  mFILE *mf;
  FILE *fp_local;
  char *mode_str_local;
  char *path_local;
  
  pcVar1 = strchr(mode_str,0x72);
  bVar4 = pcVar1 != (char *)0x0;
  local_48 = (uint)bVar4;
  pcVar1 = strchr(mode_str,0x77);
  if (pcVar1 != (char *)0x0) {
    local_48 = local_48 | 0x12;
  }
  pcVar2 = strchr(mode_str,0x61);
  bVar5 = pcVar2 != (char *)0x0;
  if (bVar5) {
    local_48 = local_48 | 6;
  }
  pcVar2 = strchr(mode_str,0x62);
  if (pcVar2 != (char *)0x0) {
    local_48 = local_48 | 8;
  }
  mode = (int)(pcVar2 != (char *)0x0);
  pcVar2 = strchr(mode_str,0x78);
  pcVar3 = strchr(mode_str,0x2b);
  if (pcVar3 != (char *)0x0) {
    local_48 = local_48 | 3;
    bVar4 = bVar5 || bVar4;
  }
  if (bVar4) {
    _w = mfcreate((char *)0x0,0);
    if (_w == (mFILE *)0x0) {
      return (mFILE *)0x0;
    }
    if ((local_48 & 0x10) == 0) {
      pcVar1 = mfload(fp,path,&_w->size,mode);
      _w->data = pcVar1;
      _w->alloced = _w->size;
      if (!bVar5) {
        fseek((FILE *)fp,0,0);
      }
    }
  }
  else {
    if (pcVar3 == (char *)0x0 && (!bVar5 && pcVar1 == (char *)0x0)) {
      fprintf(_stderr,"Must specify either r, w or a for mode\n");
      return (mFILE *)0x0;
    }
    _w = mfcreate((char *)0x0,0);
    if (_w == (mFILE *)0x0) {
      return (mFILE *)0x0;
    }
  }
  _w->fp = fp;
  _w->mode = local_48;
  if (pcVar2 != (char *)0x0) {
    _w->mode = _w->mode | 0x20;
  }
  if (bVar5) {
    _w->flush_pos = _w->size;
    fseek((FILE *)fp,0,2);
  }
  return _w;
}

Assistant:

mFILE *mfreopen(const char *path, const char *mode_str, FILE *fp) {
    mFILE *mf;
    int r = 0, w = 0, a = 0, b = 0, x = 0, mode = 0;

    /* Parse mode:
     * r = read file contents (if truncated => don't read)
     * w = write on close
     * a = position at end of buffer
     * x = position at same location as the original fp, don't seek on flush
     */
    if (strchr(mode_str, 'r'))
	r = 1, mode |= MF_READ;
    if (strchr(mode_str, 'w'))
	w = 1, mode |= MF_WRITE | MF_TRUNC;
    if (strchr(mode_str, 'a'))
	w = a = 1, mode |= MF_WRITE | MF_APPEND;
    if (strchr(mode_str, 'b'))
	b = 1, mode |= MF_BINARY;
    if (strchr(mode_str, 'x'))
	x = 1;
    if (strchr(mode_str, '+')) {
        w = 1, mode |= MF_READ | MF_WRITE;
	if (a)
	    r = 1;
    }

    if (r) {
	mf = mfcreate(NULL, 0);
	if (NULL == mf) return NULL;
	if (!(mode & MF_TRUNC)) {
	    mf->data = mfload(fp, path, &mf->size, b);
	    mf->alloced = mf->size;
	    if (!a)
		fseek(fp, 0, SEEK_SET);
	}
    } else if (w) {
	/* Write - initialise the data structures */
	mf = mfcreate(NULL, 0);
	if (NULL == mf) return NULL;
    } else {
        fprintf(stderr, "Must specify either r, w or a for mode\n");
        return NULL;
    }
    mf->fp = fp;
    mf->mode = mode;

    if (x) {
	mf->mode |= MF_MODEX;
    }
    
    if (a) {
	mf->flush_pos = mf->size;
	fseek(fp, 0, SEEK_END);
    }

    return mf;
}